

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O3

vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_> *
expectedValues<libcellml::Issue::Level>
          (vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>
           *__return_storage_ptr__,size_t size,Level value)

{
  value_type local_14;
  
  (__return_storage_ptr__->
  super__Vector_base<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>::_M_fill_assign
            (__return_storage_ptr__,size,&local_14);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> expectedValues(size_t size, T value)
{
    std::vector<T> res;

    res.assign(size, value);

    return res;
}